

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::EqualityComparisonOp<false>::EqualityComparisonOp
          (EqualityComparisonOp<false> *this,GeneratorState *state,
          ConstValueRangeAccess inValueRange)

{
  VariableType *this_00;
  ValueRange *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueRange *this_02;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pSVar5;
  pointer pSVar6;
  deRandom *rnd;
  ValueRangeAccess valueRange_00;
  Type TVar7;
  int iVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  pointer pSVar11;
  float *bMax;
  byte bVar12;
  pointer pSVar13;
  float *aMax;
  pointer pSVar14;
  float *aMin;
  long lVar15;
  uint uVar16;
  pointer pSVar17;
  float *bMin;
  float fVar18;
  float fVar19;
  Type inBaseTypes [2];
  Type val;
  ValueRange valueRange;
  Type local_1a0 [2];
  ValueRange *local_198;
  Scalar *pSStack_190;
  Scalar *local_188;
  ValueRange local_180;
  VariableType local_100;
  ValueRange local_b0;
  
  BinaryOp<8,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<8,_(rsg::Associativity)0>,CMP_NE);
  (this->super_BinaryOp<8,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_021d3118;
  ValueRange::ValueRange(&local_b0,inValueRange);
  paVar1 = &local_100.m_typeName.field_2;
  if (local_b0.m_type.m_baseType == TYPE_VOID) {
    local_100.m_baseType = TYPE_BOOL;
    local_100.m_precision = PRECISION_NONE;
    local_100.m_typeName._M_string_length = 0;
    local_100.m_typeName.field_2._M_local_buf[0] = '\0';
    local_100.m_numElements = 1;
    local_100.m_elementType = (VariableType *)0x0;
    local_100.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.m_typeName._M_dataplus._M_p = (pointer)paVar1;
    ValueRange::ValueRange(&local_180,&local_100);
    VariableType::operator=(&local_b0.m_type,&local_180.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_b0.m_min,&local_180.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_b0.m_max,&local_180.m_max);
    ValueRange::~ValueRange(&local_180);
    VariableType::~VariableType(&local_100);
    pSStack_190 = local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_190 = (Scalar *)0x0;
    }
    local_188 = local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start;
    if (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_188 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_190;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_b0.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_188;
    local_198 = &local_b0;
    computeRandomValueRange(state,valueRange_00);
  }
  this_00 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(this_00,&local_b0.m_type);
  iVar8 = VariableType::getScalarSize(this_00);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_value.m_value,(long)(iVar8 << 6));
  local_1a0[0] = TYPE_FLOAT;
  local_1a0[1] = TYPE_INT;
  local_180.m_type.m_baseType = TYPE_VOID;
  de::Random::choose<rsg::VariableType::Type*,rsg::VariableType::Type*>
            (state->m_random,local_1a0,(Type *)&local_198,(Type *)&local_180,1);
  TVar7 = local_180.m_type.m_baseType;
  iVar8 = state->m_shaderParams->maxExpressionDepth;
  iVar4 = state->m_expressionDepth;
  dVar9 = deRandom_getUint32(&state->m_random->m_rnd);
  uVar16 = (uint)(2 < iVar8 - iVar4) * 3 & dVar9;
  iVar8 = uVar16 + 1;
  local_100.m_precision = PRECISION_NONE;
  local_100.m_baseType = TVar7;
  local_100.m_typeName._M_string_length = 0;
  local_100.m_typeName.field_2._M_local_buf[0] = '\0';
  local_100.m_elementType = (VariableType *)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  local_100.m_numElements = iVar8;
  ValueRange::ValueRange(&local_180,&local_100);
  this_02 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange;
  VariableType::operator=(&this_02->m_type,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  VariableType::~VariableType(&local_100);
  local_100.m_precision = PRECISION_NONE;
  local_100.m_typeName._M_string_length = 0;
  local_100.m_typeName.field_2._M_local_buf[0] = '\0';
  local_100.m_elementType = (VariableType *)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  local_100.m_numElements = iVar8;
  ValueRange::ValueRange(&local_180,&local_100);
  this_01 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange;
  VariableType::operator=(&this_01->m_type,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  VariableType::~VariableType(&local_100);
  lVar15 = 0;
  do {
    bVar2 = (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start)->boolVal;
    bVar3 = (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start)->boolVal;
    pSVar14 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar17 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar13 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar5 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&this_01->m_type);
    if (pSVar13 == pSVar5) {
      pSVar13 = (pointer)0x0;
    }
    if (pSVar14 == pSVar17) {
      pSVar14 = (pointer)0x0;
    }
    pSVar17 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar5 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar11 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar6 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&this_02->m_type);
    aMin = (float *)((long)pSVar14 + lVar15);
    aMax = (float *)((long)pSVar13 + lVar15);
    if (pSVar11 == pSVar6) {
      pSVar11 = (pointer)0x0;
    }
    if (pSVar17 == pSVar5) {
      pSVar17 = (pointer)0x0;
    }
    bMin = (float *)((long)pSVar17 + lVar15);
    bMax = (float *)((long)pSVar11 + lVar15);
    rnd = &state->m_random->m_rnd;
    bVar12 = bVar3 ^ 1;
    if (TVar7 == TYPE_INT) {
      if (bVar2 == false && bVar12 == 0) {
        dVar9 = deRandom_getUint32(rnd);
        dVar10 = deRandom_getUint32(rnd);
        fVar18 = (float)(dVar10 % 9 - 4);
        fVar19 = (float)(dVar9 % 9 + (int)fVar18);
        *aMin = fVar18;
        *aMax = fVar19;
        *bMin = fVar18;
        *bMax = fVar19;
      }
      else if (bVar2 == false) {
        dVar9 = deRandom_getUint32(rnd);
        fVar18 = (float)(~((dVar9 / 3) * 3) + dVar9);
        *aMin = fVar18;
        *aMax = fVar18;
        *bMin = fVar18;
        *bMax = fVar18;
      }
      else {
        ComputeLessThanRange::operator()
                  ((ComputeLessThanRange *)&local_180,(Random *)rnd,true,true,(int *)aMin,
                   (int *)aMax,(int *)bMin,(int *)bMax);
      }
    }
    else if (TVar7 == TYPE_FLOAT) {
      if (bVar2 == false && bVar12 == 0) {
        dVar9 = deRandom_getUint32(rnd);
        dVar10 = deRandom_getUint32(rnd);
        fVar19 = (float)(dVar10 % 0x21) * 0.25 + -4.0;
        fVar18 = (float)(dVar9 % 0x21) * 0.25 + 0.0 + fVar19;
        *aMin = fVar19;
        *aMax = fVar18;
        *bMin = fVar19;
      }
      else {
        if (bVar2 != false) {
          ComputeLessThanRange::operator()
                    ((ComputeLessThanRange *)&local_180,(Random *)rnd,true,true,aMin,aMax,bMin,bMax)
          ;
          goto LAB_019cce7b;
        }
        dVar9 = deRandom_getUint32(rnd);
        fVar18 = (float)(dVar9 % 5) * 0.5 + -1.0;
        *aMin = fVar18;
        *aMax = fVar18;
        *bMin = fVar18;
      }
      *bMax = fVar18;
    }
    else {
      rsg::(anonymous_namespace)::computeEqualityValueRange<true,bool>
                ((Random *)rnd,(bool)(bVar12 & (bVar2 ^ 1U)),(bool)(bVar2 ^ 1U | bVar12),
                 (bool *)aMin,(bool *)aMax,(bool *)bMin,(bool *)bMax);
    }
LAB_019cce7b:
    lVar15 = lVar15 + 4;
    if ((ulong)uVar16 * 4 + 4 == lVar15) {
      ValueRange::~ValueRange(&local_b0);
      return;
    }
  } while( true );
}

Assistant:

EqualityComparisonOp<IsEqual>::EqualityComparisonOp (GeneratorState& state, ConstValueRangeAccess inValueRange)
	: BinaryOp<8, ASSOCIATIVITY_LEFT>(IsEqual ? Token::CMP_EQ : Token::CMP_NE)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		valueRange = ValueRange(VariableType(VariableType::TYPE_BOOL, 1));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Choose random input type
	VariableType::Type inBaseTypes[]	= { VariableType::TYPE_FLOAT, VariableType::TYPE_INT };
	VariableType::Type inBaseType		= state.getRandom().choose<VariableType::Type>(&inBaseTypes[0], &inBaseTypes[DE_LENGTH_OF_ARRAY(inBaseTypes)]);
	int					availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
	int					numElements		= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

	// Initialize storage for input value ranges
	this->m_rightValueRange	= ValueRange(VariableType(inBaseType, numElements));
	this->m_leftValueRange	= ValueRange(VariableType(inBaseType, numElements));

	// Compute range for b that satisfies requested value range
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		bool					dstMin	= valueRange.getMin().asBool();
		bool					dstMax	= valueRange.getMax().asBool();

		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elementNdx);
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elementNdx);

		if (inBaseType == VariableType::TYPE_FLOAT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asFloat(), a.getMax().asFloat(),
											   b.getMin().asFloat(), b.getMax().asFloat());
		else if (inBaseType == VariableType::TYPE_INT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asInt(), a.getMax().asInt(),
											   b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(inBaseType == VariableType::TYPE_BOOL);
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asBool(), a.getMax().asBool(),
											   b.getMin().asBool(), b.getMax().asBool());
		}
	}
}